

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_data.hpp
# Opt level: O3

bool ex::readDataSet(string *dir_name,
                    vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                    *points,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *answers,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                    *distances)

{
  error_code *peVar1;
  pointer pcVar2;
  element_type *this;
  directory_iterator dVar3;
  char cVar4;
  int iVar5;
  istream *piVar6;
  WeightVectorPhrase *__p;
  ostream *poVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_330;
  ifstream fi;
  dir_itr_imp local_320 [16];
  byte abStack_310 [488];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_128;
  _func_int **local_120;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *local_118;
  vector<std::shared_ptr<wv::AbstractWeightVector>,std::allocator<std::shared_ptr<wv::AbstractWeightVector>>>
  *local_110;
  undefined1 local_108 [8];
  string line;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> arr;
  undefined1 local_c8 [8];
  shared_ptr<wv::WeightVectorPhrase> swv;
  size_type *local_a8;
  path targetDir;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_80;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  concr_phrase;
  directory_iterator local_58;
  directory_iterator it;
  directory_iterator eod;
  directory_iterator local_40;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *local_38;
  
  local_a8 = &targetDir.m_pathname._M_string_length;
  pcVar2 = (dir_name->_M_dataplus)._M_p;
  local_128 = answers;
  local_118 = distances;
  local_110 = (vector<std::shared_ptr<wv::AbstractWeightVector>,std::allocator<std::shared_ptr<wv::AbstractWeightVector>>>
               *)points;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_58,(path *)&local_a8,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_330 = local_58.m_imp.px;
  if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
    UNLOCK();
    if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
      UNLOCK();
    }
  }
  local_80.px = (dir_itr_imp *)0x0;
  targetDir.m_pathname.field_2._8_8_ = local_58.m_imp.px;
  _fi = 0;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_330);
  local_330.px = (dir_itr_imp *)targetDir.m_pathname.field_2._8_8_;
  if (targetDir.m_pathname.field_2._8_8_ == 0) {
    local_40.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)targetDir.m_pathname.field_2._8_8_ = *(int *)targetDir.m_pathname.field_2._8_8_ + 1;
    UNLOCK();
    local_40.m_imp.px =
         (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
         (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)targetDir.m_pathname.field_2._8_8_;
    if (targetDir.m_pathname.field_2._8_8_ != 0) {
      LOCK();
      *(int *)targetDir.m_pathname.field_2._8_8_ = *(int *)targetDir.m_pathname.field_2._8_8_ + 1;
      UNLOCK();
    }
  }
  local_38 = &local_80;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_330);
  local_330.px = local_80.px;
  if (local_80.px == (dir_itr_imp *)0x0) {
    eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)local_80.px = *(int *)local_80.px + 1;
    UNLOCK();
    eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                   (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_80.px;
    if (local_80.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_80.px = *(int *)local_80.px + 1;
      UNLOCK();
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_330);
  local_120 = (_func_int **)&PTR_calcDistance_00147c68;
  while (dVar3.m_imp.px = local_40.m_imp.px, local_40.m_imp.px != eod.m_imp.px) {
    if ((local_40.m_imp.px == (dir_itr_imp *)0x0) ||
       (*(long *)((long)local_40.m_imp.px + 0x38) == 0)) {
      if ((eod.m_imp.px == (dir_itr_imp *)0x0) || (*(long *)((long)eod.m_imp.px + 0x38) == 0))
      break;
      if ((local_40.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_40.m_imp.px + 0x38) == 0)) {
        __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                      "/usr/include/boost/filesystem/directory.hpp",0x140,
                      "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                     );
      }
    }
    peVar1 = (error_code *)((long)local_40.m_imp.px + 8);
    boost::filesystem::detail::status((path *)&local_330,peVar1);
    if ((int)local_330.px == 2) {
      boost::filesystem::path::extension();
      iVar5 = boost::filesystem::path::compare((path *)&local_330,"swp");
      if (local_330.px != local_320) {
        operator_delete(local_330.px);
      }
      if (iVar5 != 0) {
        std::ifstream::ifstream((istream *)&local_330,(string *)peVar1,_S_in);
        if ((abStack_310[*(long *)(local_330.px + -0x18)] & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,*(char **)((long)dVar3.m_imp.px + 8),
                              *(long *)((long)dVar3.m_imp.px + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"doesn\'t exist",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::ifstream::~ifstream(&local_330);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                    (&local_40.m_imp);
          bVar8 = false;
          goto LAB_001204e1;
        }
        local_108 = (undefined1  [8])&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        concr_phrase.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_78 = (undefined1  [8])0x0;
        concr_phrase.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        while( true ) {
          cVar4 = std::ios::widen((char)*(undefined8 *)(local_330.px + -0x18) +
                                  (char)(istream *)&local_330);
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&local_330,(string *)local_108,cVar4);
          if ((((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) ||
             (line._M_dataplus._M_p == (pointer)0x0)) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_78,(value_type *)local_108);
        }
        cont::
        StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&line.field_2 + 8),
                      (uint32_t)
                      ((ulong)((long)concr_phrase.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78)
                      >> 5));
        if ((undefined1  [8])
            concr_phrase.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != auStack_78) {
          uVar9 = 1;
          uVar10 = 0;
          do {
            std::__cxx11::string::_M_assign((string *)(uVar10 * 0x20 + line.field_2._8_8_));
            uVar10 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar10 < (ulong)((long)concr_phrase.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start -
                                    (long)auStack_78 >> 5));
        }
        boost::filesystem::path::filename();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_128,(value_type *)local_c8);
        if (local_c8 !=
            (undefined1  [8])
            &swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        {
          operator_delete((void *)local_c8);
        }
        __p = (WeightVectorPhrase *)operator_new(0x20);
        (__p->super_AbstractWeightVector)._vptr_AbstractWeightVector = local_120;
        cont::
        StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::StaticArray(&__p->m_Coords,
                      (StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&line.field_2 + 8));
        __p->m_Distances = local_118;
        local_c8 = (undefined1  [8])__p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wv::WeightVectorPhrase*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&swv,__p);
        this = swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        arr._8_8_ = local_c8;
        if (swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_Coords).m_MasPoint =
                 *(int *)&((swv.
                            super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_Coords).m_MasPoint + 1;
            UNLOCK();
          }
          else {
            *(int *)&((swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_Coords).m_MasPoint =
                 *(int *)&((swv.
                            super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_Coords).m_MasPoint + 1;
          }
        }
        std::
        vector<std::shared_ptr<wv::AbstractWeightVector>,std::allocator<std::shared_ptr<wv::AbstractWeightVector>>>
        ::emplace_back<std::shared_ptr<wv::AbstractWeightVector>>
                  (local_110,(shared_ptr<wv::AbstractWeightVector> *)&arr.m_Size);
        if (this != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
        }
        if (swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        cont::
        StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&line.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_78);
        if (local_108 != (undefined1  [8])&line._M_string_length) {
          operator_delete((void *)local_108);
        }
        std::ifstream::~ifstream((istream *)&local_330);
      }
    }
    boost::filesystem::detail::directory_iterator_increment(&local_40,(error_code *)0x0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40.m_imp);
  bVar8 = true;
LAB_001204e1:
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(local_38);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)
             ((long)&targetDir.m_pathname.field_2 + 8));
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_58.m_imp);
  if (local_a8 != &targetDir.m_pathname._M_string_length) {
    operator_delete(local_a8);
  }
  return bVar8;
}

Assistant:

bool readDataSet(const std::string& dir_name, std::vector<std::shared_ptr<wv::Point>>& points, std::vector<std::string>& answers, const std::unordered_map<std::string, std::unordered_map<std::string, double>>& distances)
    {
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<std::string> concr_phrase;
                while (std::getline(fi, line) and !line.empty())
                {
                    concr_phrase.push_back(line);
                }
                
                cont::StaticArray<std::string> arr(concr_phrase.size());
                for (uint32_t i = 0; i < concr_phrase.size(); i++)
                    arr[i] = concr_phrase[i];
                    
                answers.push_back(p.filename().string());
                std::shared_ptr<wv::WeightVectorPhrase> swv(new wv::WeightVectorPhrase(arr, distances));
                points.push_back(swv);
            } 
        }
        return true;
    }